

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
JsonObject_TrailingCommaExtensionEnabled_Test::JsonObject_TrailingCommaExtensionEnabled_Test
          (JsonObject_TrailingCommaExtensionEnabled_Test *this)

{
  anon_unknown.dwarf_151a55::JsonObject::JsonObject(&this->super_JsonObject);
  (this->super_JsonObject).super_Test._vptr_Test = (_func_int **)&PTR__JsonObject_001ac758;
  return;
}

Assistant:

TEST_F (JsonObject, TrailingCommaExtensionEnabled) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, key ("a")).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (16)).Times (1);
        EXPECT_CALL (callbacks_, key ("b")).Times (1);
        EXPECT_CALL (callbacks_, string_value ("c")).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }

    // An object with a trailing comma but with the extension _enabled_. Note that there is
    // deliberate whitespace around the final comma.
    auto p = json::make_parser (proxy_, json::extensions::object_trailing_comma);
    p.input (R"({ "a":16, "b":"c" , })"s).eof ();
    EXPECT_FALSE (p.has_error ());
}